

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::Extern::MatchImpl<wabt::interp::TableType>
          (Extern *this,Store *store,ImportType *import_type,TableType *actual,Ptr *out_trap)

{
  TableType *expected;
  Result RVar1;
  ulong uVar2;
  Enum EVar3;
  char *pcVar4;
  string msg;
  string local_88;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  expected = (TableType *)
             (import_type->type)._M_t.
             super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
             .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  if ((expected == (TableType *)0x0) ||
     (*(ExternKind *)((long)&expected->super_ExternType + 8) != Table)) {
    uVar2 = (ulong)*(ExternKind *)((long)&expected->super_ExternType + 8);
    if (uVar2 < 5) {
      pcVar4 = (char *)(&g_kind_name)[uVar2];
    }
    else {
      pcVar4 = "<error_kind>";
    }
    StringPrintf_abi_cxx11_
              (&local_88,"expected import \"%s.%s\" to have kind %s, not %s",
               (import_type->module)._M_dataplus._M_p,(import_type->name)._M_dataplus._M_p,pcVar4,
               DAT_00248958);
    local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,store,store,&local_88,&local_68);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.root_index_ = 0;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    if (local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    EVar3 = Error;
  }
  else {
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    RVar1 = Match(expected,actual,&local_88);
    EVar3 = Ok;
    if (RVar1.enum_ == Error) {
      local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      Store::
      Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                (&local_48,store,store,&local_88,&local_68);
      out_trap->obj_ = local_48.obj_;
      out_trap->store_ = local_48.store_;
      out_trap->root_index_ = local_48.root_index_;
      local_48.root_index_ = 0;
      local_48.obj_ = (Trap *)0x0;
      local_48.store_ = (Store *)0x0;
      if (local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      EVar3 = Error;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Extern::MatchImpl(Store& store,
                         const ImportType& import_type,
                         const T& actual,
                         Trap::Ptr* out_trap) {
  const T* extern_type = dyn_cast<T>(import_type.type.get());
  if (!extern_type) {
    *out_trap = Trap::New(
        store,
        StringPrintf("expected import \"%s.%s\" to have kind %s, not %s",
                     import_type.module.c_str(), import_type.name.c_str(),
                     GetName(import_type.type->kind), GetName(T::skind)));
    return Result::Error;
  }

  std::string msg;
  if (Failed(interp::Match(*extern_type, actual, &msg))) {
    *out_trap = Trap::New(store, msg);
    return Result::Error;
  }

  return Result::Ok;
}